

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMessenger.cxx
# Opt level: O3

void __thiscall
cmMessenger::DisplayMessage
          (cmMessenger *this,MessageType t,string *text,cmListFileBacktrace *backtrace)

{
  long lVar1;
  char *pcVar2;
  ostringstream msg;
  undefined1 local_190 [376];
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_190);
  if (t < (DEPRECATION_WARNING|AUTHOR_ERROR)) {
    pcVar2 = &DAT_0056649c + *(int *)(&DAT_0056649c + (ulong)t * 4);
    lVar1 = *(long *)(&DAT_005664c0 + (ulong)t * 8);
  }
  else {
    lVar1 = 0xd;
    pcVar2 = "CMake Warning";
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190,pcVar2,lVar1);
  cmListFileBacktrace::PrintTitle(backtrace,(ostream *)local_190);
  printMessageText((ostream *)local_190,text);
  cmListFileBacktrace::PrintCallStack(backtrace,(ostream *)local_190);
  displayMessage(t,(ostringstream *)local_190);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_190);
  std::ios_base::~ios_base((ios_base *)(local_190 + 0x70));
  return;
}

Assistant:

void cmMessenger::DisplayMessage(MessageType t, const std::string& text,
                                 const cmListFileBacktrace& backtrace) const
{
  std::ostringstream msg;
  if (!printMessagePreamble(t, msg)) {
    return;
  }

  // Add the immediate context.
  backtrace.PrintTitle(msg);

  printMessageText(msg, text);

  // Add the rest of the context.
  backtrace.PrintCallStack(msg);

  displayMessage(t, msg);
}